

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

JSValue js_std_file_tell(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int is_bigint)

{
  FILE *__stream;
  ulong uVar1;
  JSValueUnion JVar2;
  bool bVar3;
  JSValue JVar4;
  JSValue JVar5;
  
  __stream = (FILE *)js_std_file_get(ctx,this_val);
  if (__stream == (FILE *)0x0) {
    JVar4 = (JSValue)(ZEXT816(6) << 0x40);
    uVar1 = 0;
  }
  else {
    uVar1 = ftello(__stream);
    if (is_bigint == 0) {
      bVar3 = (long)(int)uVar1 == uVar1;
      JVar2.float64 = (double)(long)uVar1;
      if (bVar3) {
        JVar2.ptr = (void *)(uVar1 & 0xffffffff);
      }
      JVar4.tag = 7;
      JVar4.u.float64 = JVar2.float64;
      if (bVar3) {
        JVar4.tag = 0;
      }
    }
    else {
      JVar4 = JS_NewBigInt64(ctx,uVar1);
    }
    uVar1 = (ulong)JVar4.u.ptr & 0xffffffff00000000;
  }
  JVar5.tag = JVar4.tag;
  JVar5.u.ptr = (void *)(JVar4.u._0_4_ | uVar1);
  return JVar5;
}

Assistant:

static JSValue js_std_file_tell(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv, int is_bigint)
{
    FILE *f = js_std_file_get(ctx, this_val);
    int64_t pos;
    if (!f)
        return JS_EXCEPTION;
#if defined(__linux__)
    pos = ftello(f);
#else
    pos = ftell(f);
#endif
    if (is_bigint)
        return JS_NewBigInt64(ctx, pos);
    else
        return JS_NewInt64(ctx, pos);
}